

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaClp.c
# Opt level: O0

Gia_Man_t * Gia_ManCollapseTest(Gia_Man_t *p,int fVerbose)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  DdManager *unique;
  Vec_Ptr_t *p_00;
  DdManager *dd_00;
  DdNode **ppDVar6;
  ulong uVar7;
  Dsd_Manager_t *pDsdMan;
  Vec_Ptr_t *p_01;
  Vec_Ptr_t *p_02;
  char **pInputNames;
  char **pOutputNames;
  char **ppNamesCo;
  char **ppNamesCi;
  Vec_Ptr_t *vNamesCo;
  Vec_Ptr_t *vNamesCi;
  Vec_Ptr_t *vFuncs;
  Dsd_Manager_t *pManDsd;
  DdManager *ddNew;
  DdManager *dd;
  Gia_Man_t *pNew;
  int fVerbose_local;
  Gia_Man_t *p_local;
  
  uVar1 = Gia_ManCiNum(p);
  unique = Cudd_Init(uVar1,0,0x100,0x40000,0);
  Cudd_AutodynEnable(unique,CUDD_REORDER_SYMM_SIFT);
  p_00 = Gia_ManCollapse(p,unique,10000,0);
  Cudd_AutodynDisable(unique);
  if (p_00 == (Vec_Ptr_t *)0x0) {
    Extra_StopManager(unique);
    p_local = Gia_ManDup(p);
  }
  else {
    uVar1 = Gia_ManCiNum(p);
    dd_00 = Cudd_Init(uVar1,0,0x100,0x40000,0);
    Cudd_zddVarsFromBddVars(dd_00,2);
    if (fVerbose != 0) {
      uVar1 = Gia_ManCiNum(p);
      uVar2 = Gia_ManCoNum(p);
      ppDVar6 = (DdNode **)Vec_PtrArray(p_00);
      iVar3 = Vec_PtrSize(p_00);
      uVar4 = Cudd_SharingSize(ppDVar6,iVar3);
      uVar5 = Cudd_ReadPeakLiveNodeCount(unique);
      uVar7 = Cudd_ReadNodeCount(unique);
      printf("Ins = %d. Outs = %d.  Shared BDD nodes = %d.  Peak live nodes = %d. Peak nodes = %d.\n"
             ,(ulong)uVar1,(ulong)uVar2,(ulong)uVar4,(ulong)uVar5,uVar7 & 0xffffffff);
    }
    iVar3 = Gia_ManCiNum(p);
    pDsdMan = Dsd_ManagerStart(unique,iVar3,0);
    ppDVar6 = (DdNode **)Vec_PtrArray(p_00);
    iVar3 = Vec_PtrSize(p_00);
    Dsd_Decompose(pDsdMan,ppDVar6,iVar3);
    if (fVerbose != 0) {
      iVar3 = Gia_ManCiNum(p);
      p_01 = Gia_GetFakeNames(iVar3);
      iVar3 = Gia_ManCoNum(p);
      p_02 = Gia_GetFakeNames(iVar3);
      pInputNames = (char **)Vec_PtrArray(p_01);
      pOutputNames = (char **)Vec_PtrArray(p_02);
      Dsd_TreePrint(_stdout,pDsdMan,pInputNames,pOutputNames,0,-1);
      Vec_PtrFreeFree(p_01);
      Vec_PtrFreeFree(p_02);
    }
    p_local = Gia_ManRebuild(p,pDsdMan,dd_00);
    Dsd_ManagerStop(pDsdMan);
    Gia_ManCollapseDeref(unique,p_00);
    Extra_StopManager(unique);
    Extra_StopManager(dd_00);
  }
  return p_local;
}

Assistant:

Gia_Man_t * Gia_ManCollapseTest( Gia_Man_t * p, int fVerbose )
{
    Gia_Man_t * pNew;
    DdManager * dd, * ddNew;
    Dsd_Manager_t * pManDsd;
    Vec_Ptr_t * vFuncs;
    // derive global BDDs
    dd = Cudd_Init( Gia_ManCiNum(p), 0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );
    Cudd_AutodynEnable( dd,  CUDD_REORDER_SYMM_SIFT );
    vFuncs = Gia_ManCollapse( p, dd, 10000, 0 );
    Cudd_AutodynDisable( dd );
    if ( vFuncs == NULL ) 
    {
        Extra_StopManager( dd );
        return Gia_ManDup(p);
    }
    // start ISOP manager
    ddNew = Cudd_Init( Gia_ManCiNum(p), 0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );
    Cudd_zddVarsFromBddVars( ddNew, 2 );
//    Cudd_ReduceHeap( dd, CUDD_REORDER_SYMM_SIFT, 100 );
    if ( fVerbose )
    printf( "Ins = %d. Outs = %d.  Shared BDD nodes = %d.  Peak live nodes = %d. Peak nodes = %d.\n", 
        Gia_ManCiNum(p), Gia_ManCoNum(p), 
        Cudd_SharingSize( (DdNode **)Vec_PtrArray(vFuncs), Vec_PtrSize(vFuncs) ),
        Cudd_ReadPeakLiveNodeCount(dd), (int)Cudd_ReadNodeCount(dd) );
    // perform decomposition
    pManDsd = Dsd_ManagerStart( dd, Gia_ManCiNum(p), 0 );
    Dsd_Decompose( pManDsd, (DdNode **)Vec_PtrArray(vFuncs), Vec_PtrSize(vFuncs) );
    if ( fVerbose )
    {
        Vec_Ptr_t * vNamesCi = Gia_GetFakeNames( Gia_ManCiNum(p) );
        Vec_Ptr_t * vNamesCo = Gia_GetFakeNames( Gia_ManCoNum(p) );
        char ** ppNamesCi = (char **)Vec_PtrArray( vNamesCi );
        char ** ppNamesCo = (char **)Vec_PtrArray( vNamesCo );
        Dsd_TreePrint( stdout, pManDsd, ppNamesCi, ppNamesCo, 0, -1 );
        Vec_PtrFreeFree( vNamesCi );
        Vec_PtrFreeFree( vNamesCo );
    }

    pNew = Gia_ManRebuild( p, pManDsd, ddNew );
    Dsd_ManagerStop( pManDsd );
    // return manager
    Gia_ManCollapseDeref( dd, vFuncs );
    Extra_StopManager( dd );
    Extra_StopManager( ddNew );
    return pNew;
}